

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ArrayPtr<const_kj::CidrRange> kj::_::privateCidrs(void)

{
  int iVar1;
  size_t size;
  StringPtr SVar2;
  ArrayPtr<const_kj::CidrRange> AVar3;
  
  if (privateCidrs()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&privateCidrs()::result);
    if (iVar1 != 0) {
      SVar2 = operator____kj("10.0.0.0/8",10);
      CidrRange::CidrRange((CidrRange *)privateCidrs()::result,SVar2);
      SVar2 = operator____kj("100.64.0.0/10",0xd);
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x18),SVar2);
      SVar2 = operator____kj("169.254.0.0/16",0xe);
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x30),SVar2);
      SVar2 = operator____kj("172.16.0.0/12",0xd);
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x48),SVar2);
      SVar2 = operator____kj("192.168.0.0/16",0xe);
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x60),SVar2);
      SVar2 = operator____kj("fc00::/7",8);
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x78),SVar2);
      SVar2 = operator____kj("fe80::/10",9);
      CidrRange::CidrRange((CidrRange *)(privateCidrs()::result + 0x90),SVar2);
      __cxa_guard_release(&privateCidrs()::result);
    }
  }
  size = size<kj::CidrRange_const,7ul>(privateCidrs()::result);
  AVar3 = arrayPtr<kj::CidrRange_const>((CidrRange *)privateCidrs()::result,size);
  return AVar3;
}

Assistant:

ArrayPtr<const CidrRange> privateCidrs() {
  static const CidrRange result[] = {
    "10.0.0.0/8"_kj,            // RFC1918 reserved for internal network
    "100.64.0.0/10"_kj,         // RFC6598 "shared address space" for carrier-grade NAT
    "169.254.0.0/16"_kj,        // RFC3927 "link local" (auto-configured LAN in absence of DHCP)
    "172.16.0.0/12"_kj,         // RFC1918 reserved for internal network
    "192.168.0.0/16"_kj,        // RFC1918 reserved for internal network

    "fc00::/7"_kj,              // RFC4193 unique private network
    "fe80::/10"_kj,             // RFC4291 "link local" (auto-configured LAN in absence of DHCP)
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}